

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QTzTimeZoneCacheEntry * QTzTimeZoneCache::findEntry(QByteArray *ianaId)

{
  int iVar1;
  bool bVar2;
  quint8 qVar3;
  uint uVar4;
  Status SVar5;
  int iVar6;
  int iVar7;
  qsizetype qVar8;
  reference pQVar9;
  const_reference pQVar10;
  const_reference pQVar11;
  qsizetype qVar12;
  int __oflag;
  QTzTimeZoneCacheEntry *in_RDI;
  long in_FS_OFFSET;
  int ruleIndex;
  int newUtc;
  int j;
  int inferStd;
  QTzTransition *tz_tran;
  int i_1;
  int lastDstOff;
  int tranCount;
  QTzTransition *tran;
  add_const_t<QList<QTzTransition>_> *__range1;
  int utcOffset;
  int i;
  int size;
  QTzTimeZoneCacheEntry *ret;
  char16_t *str;
  QTzType new_type;
  QTzType tz_type;
  QTzTransitionTime tran_1;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator end;
  const_iterator it;
  QList<int> abbrindList;
  anon_struct_2_2_9f07e537 check_1;
  QMap<int,_QByteArray> abbrevMap;
  QList<QTzType> typeList;
  QList<QTzTransition> tranList;
  QByteArray posixRule;
  bool ok;
  anon_struct_2_2_9f07e537 check;
  QFile tzif;
  QTzTransitionRule rule;
  QDataStream ds;
  QTzHeader hdr2;
  QTzHeader hdr;
  undefined4 in_stack_fffffffffffffbd8;
  OpenModeFlag in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  QDataStream *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  QTzTransition *in_stack_fffffffffffffc08;
  QDataStream *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  QDataStream *in_stack_fffffffffffffc28;
  QList<QTzType> *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc54;
  undefined1 requireOffset;
  QDataStream *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  QDataStream *in_stack_fffffffffffffc68;
  QFile *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  int local_2f0;
  int local_2dc;
  int local_2d8;
  int local_2bc;
  int local_2b8;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  QTzType local_260;
  QTzType local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  QTzTransition *local_240;
  const_iterator local_238;
  const_iterator local_230;
  const_iterator local_228;
  const_iterator local_220;
  undefined1 *local_218;
  undefined1 *puStack_210;
  undefined1 *local_208;
  anon_struct_2_2_9f07e537 local_1f2;
  undefined1 *local_170;
  QList<QTzType> local_168;
  QList<QTzTransition> local_148;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  byte local_10b;
  anon_struct_2_2_9f07e537 local_10a;
  uint local_ec;
  QArrayDataPointer<char16_t> local_e8 [2];
  QFile local_b8;
  undefined8 local_a0;
  undefined4 local_98;
  int local_94;
  undefined4 uStack_90;
  quint8 local_8c;
  undefined1 local_88 [24];
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined1 *puStack_44;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined1 *puStack_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined1 *puStack_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->m_preZoneRule = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_posixRule).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_posixRule).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_abbreviations).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_posixRule).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_abbreviations).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_abbreviations).d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranRules).d.ptr = (QTzTransitionRule *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranRules).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranTimes).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranRules).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranTimes).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m_tranTimes).d.ptr = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
  QTzTimeZoneCacheEntry::QTzTimeZoneCacheEntry
            ((QTzTimeZoneCacheEntry *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))
  ;
  local_b8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  bVar2 = QByteArray::isEmpty((QByteArray *)0x7491c9);
  if (bVar2) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_e8,(Data *)0x0,L"/etc/localtime",0xe);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    QFile::setFileName((QFile *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       (QString *)in_stack_fffffffffffffbe8);
    QString::~QString((QString *)0x74925a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbdc);
    uVar4 = QFile::open(&local_b8,(char *)(ulong)local_ec,__oflag);
    if ((uVar4 & 1) == 0) goto LAB_0074a5e8;
  }
  else {
    QString::fromLocal8Bit<void>
              ((QByteArray *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    bVar2 = openZoneInfo((QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         in_stack_fffffffffffffc90);
    QString::~QString((QString *)0x7493a1);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      local_10a.isValid = true;
      local_10a.hasDst = true;
      local_10a = validatePosixRule((QByteArray *)in_stack_fffffffffffffc58,
                                    SUB41((uint)in_stack_fffffffffffffc54 >> 0x18,0));
      if (((ushort)local_10a & 1) != 0) {
        in_RDI->m_hasDst = (bool)(local_10a.hasDst & 1);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      }
      goto LAB_0074a5e8;
    }
  }
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)local_88,(QIODevice *)&local_b8);
  local_10b = 0;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x7494c4);
  uStack_18 = 0xaaaaaaaa;
  puStack_14 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaa;
  local_1c = 0xaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  parseTzHeader((QDataStream *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                (bool *)in_stack_fffffffffffffbe8);
  if (((local_10b & 1) != 0) && (SVar5 = QDataStream::status((QDataStream *)local_88), SVar5 == Ok))
  {
    local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    parseTzTransitions(in_stack_fffffffffffffc68,(int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffc60 >> 0x18,0));
    SVar5 = QDataStream::status((QDataStream *)local_88);
    if (SVar5 == Ok) {
      local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      parseTzTypes(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
      SVar5 = QDataStream::status((QDataStream *)local_88);
      if (SVar5 == Ok) {
        local_170 = &DAT_aaaaaaaaaaaaaaaa;
        parseTzAbbreviations
                  (in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,in_stack_fffffffffffffc48);
        SVar5 = QDataStream::status((QDataStream *)local_88);
        if (SVar5 == Ok) {
          parseTzLeapSeconds(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                             SUB41((uint)in_stack_fffffffffffffbe0 >> 0x18,0));
          SVar5 = QDataStream::status((QDataStream *)local_88);
          if (SVar5 == Ok) {
            parseTzIndicators(in_stack_fffffffffffffc28,
                              (QList<QTzType> *)
                              CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                              (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                              (int)in_stack_fffffffffffffc18);
            QList<QTzType>::operator=
                      ((QList<QTzType> *)
                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (QList<QTzType> *)
                       CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
            QList<QTzType>::~QList((QList<QTzType> *)0x7497ca);
            SVar5 = QDataStream::status((QDataStream *)local_88);
            if (SVar5 == Ok) {
              if ((local_38._4_1_ == '2') || (local_38._4_1_ == '3')) {
                local_10b = 0;
                uStack_48 = 0xaaaaaaaa;
                puStack_44 = &DAT_aaaaaaaaaaaaaaaa;
                local_58 = &DAT_aaaaaaaaaaaaaaaa;
                uStack_50 = 0xaaaaaaaa;
                uStack_4c = 0xaaaaaaaa;
                local_68 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
                parseTzHeader((QDataStream *)
                              CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                              (bool *)in_stack_fffffffffffffbe8);
                if (((local_10b & 1) != 0) &&
                   (SVar5 = QDataStream::status((QDataStream *)local_88), SVar5 == Ok)) {
                  parseTzTransitions(in_stack_fffffffffffffc68,
                                     (int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                                     SUB81((ulong)in_stack_fffffffffffffc60 >> 0x18,0));
                  QList<QTzTransition>::operator=
                            ((QList<QTzTransition> *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (QList<QTzTransition> *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  QList<QTzTransition>::~QList((QList<QTzTransition> *)0x7498f9);
                  SVar5 = QDataStream::status((QDataStream *)local_88);
                  if (SVar5 == Ok) {
                    parseTzTypes(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
                    QList<QTzType>::operator=
                              ((QList<QTzType> *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               (QList<QTzType> *)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                    QList<QTzType>::~QList((QList<QTzType> *)0x74997b);
                    SVar5 = QDataStream::status((QDataStream *)local_88);
                    if (SVar5 == Ok) {
                      parseTzAbbreviations
                                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
                                 in_stack_fffffffffffffc48);
                      QMap<int,_QByteArray>::operator=
                                ((QMap<int,_QByteArray> *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 (QMap<int,_QByteArray> *)
                                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                      QMap<int,_QByteArray>::~QMap((QMap<int,_QByteArray> *)0x749a05);
                      SVar5 = QDataStream::status((QDataStream *)local_88);
                      if (SVar5 == Ok) {
                        parseTzLeapSeconds(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                                           SUB41((uint)in_stack_fffffffffffffbe0 >> 0x18,0));
                        SVar5 = QDataStream::status((QDataStream *)local_88);
                        if (SVar5 == Ok) {
                          parseTzIndicators(in_stack_fffffffffffffc28,
                                            (QList<QTzType> *)
                                            CONCAT44(in_stack_fffffffffffffc24,
                                                     in_stack_fffffffffffffc20),
                                            (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                                            (int)in_stack_fffffffffffffc18);
                          QList<QTzType>::operator=
                                    ((QList<QTzType> *)
                                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                     (QList<QTzType> *)
                                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                          QList<QTzType>::~QList((QList<QTzType> *)0x749aec);
                          SVar5 = QDataStream::status((QDataStream *)local_88);
                          if (SVar5 == Ok) {
                            parseTzPosixRule(in_stack_fffffffffffffc18);
                            QByteArray::operator=
                                      ((QByteArray *)
                                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                                       ,(QByteArray *)
                                        CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8
                                                ));
                            QByteArray::~QByteArray((QByteArray *)0x749b67);
                            SVar5 = QDataStream::status((QDataStream *)local_88);
                            if (SVar5 == Ok) goto LAB_00749ba3;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_00749ba3:
                requireOffset = (undefined1)((uint)in_stack_fffffffffffffc54 >> 0x18);
                bVar2 = QByteArray::isEmpty((QByteArray *)0x749bb0);
                if (!bVar2) {
                  local_1f2.isValid = true;
                  local_1f2.hasDst = true;
                  local_1f2 = validatePosixRule((QByteArray *)in_stack_fffffffffffffc58,
                                                (bool)requireOffset);
                  if (((ushort)local_1f2 & 1) == 0) goto LAB_0074a556;
                  QByteArray::operator=
                            ((QByteArray *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (QByteArray *)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  in_RDI->m_hasDst = (bool)(local_1f2.hasDst & 1);
                }
                QMap<int,_QByteArray>::size
                          ((QMap<int,_QByteArray> *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
                QList<QByteArray>::clear
                          ((QList<QByteArray> *)
                           CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
                QList<QByteArray>::reserve
                          ((QList<QByteArray> *)in_stack_fffffffffffffc28,
                           (qsizetype)in_stack_fffffffffffffc68);
                local_218 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_210 = &DAT_aaaaaaaaaaaaaaaa;
                local_208 = &DAT_aaaaaaaaaaaaaaaa;
                QList<int>::QList((QList<int> *)0x749cc5);
                QList<int>::reserve((QList<int> *)in_stack_fffffffffffffc08,
                                    (qsizetype)in_stack_fffffffffffffc48);
                local_220._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
                local_220._M_node =
                     (_Base_ptr)
                     QMap<int,_QByteArray>::cbegin
                               ((QMap<int,_QByteArray> *)
                                CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                local_228._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
                local_228._M_node =
                     (_Base_ptr)
                     QMap<int,_QByteArray>::cend
                               ((QMap<int,_QByteArray> *)
                                CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                while (bVar2 = ::operator!=((const_iterator *)
                                            CONCAT44(in_stack_fffffffffffffbe4,
                                                     in_stack_fffffffffffffbe0),
                                            (const_iterator *)
                                            CONCAT44(in_stack_fffffffffffffbdc,
                                                     in_stack_fffffffffffffbd8)), bVar2) {
                  in_stack_fffffffffffffc48 =
                       (QList<QTzType> *)
                       QMap<int,_QByteArray>::const_iterator::value((const_iterator *)0x749d94);
                  QList<QByteArray>::append
                            ((QList<QByteArray> *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (parameter_type)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  QMap<int,_QByteArray>::const_iterator::key((const_iterator *)0x749db9);
                  QList<int>::append((QList<int> *)0x749dd4,in_stack_fffffffffffffbdc);
                  QMap<int,_QByteArray>::const_iterator::operator++
                            ((const_iterator *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
                }
                for (local_2b8 = 0; qVar8 = QList<QTzType>::size(&local_168), local_2b8 < qVar8;
                    local_2b8 = local_2b8 + 1) {
                  QList<QTzType>::at((QList<QTzType> *)
                                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                     CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  qVar8 = QListSpecialMethodsBase<int>::indexOf<unsigned_char>
                                    ((QListSpecialMethodsBase<int> *)
                                     CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                     (uchar *)in_stack_fffffffffffffbe8,
                                     CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
                  qVar3 = (quint8)qVar8;
                  pQVar9 = QList<QTzType>::operator[]
                                     ((QList<QTzType> *)
                                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                      CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
                  ;
                  pQVar9->tz_abbrind = qVar3;
                }
                qVar8 = QList<QTzType>::size(&local_168);
                if (qVar8 != 0) {
                  pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                               CONCAT44(in_stack_fffffffffffffbe4,
                                                        in_stack_fffffffffffffbe0),
                                               CONCAT44(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8));
                  local_94 = pQVar10->tz_gmtoff;
                  uStack_90 = 0;
                  pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                               CONCAT44(in_stack_fffffffffffffbe4,
                                                        in_stack_fffffffffffffbe0),
                                               CONCAT44(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8));
                  local_8c = pQVar10->tz_abbrind;
                  (in_RDI->m_preZoneRule).stdOffset = local_94;
                  (in_RDI->m_preZoneRule).dstOffset = uStack_90;
                  (in_RDI->m_preZoneRule).abbreviationIndex = local_8c;
                }
                local_2bc = (in_RDI->m_preZoneRule).stdOffset;
                local_230.i = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                local_230 = QList<QTzTransition>::begin
                                      ((QList<QTzTransition> *)
                                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                                      );
                local_238.i = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
                local_238 = QList<QTzTransition>::end
                                      ((QList<QTzTransition> *)
                                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                                      );
                while( true ) {
                  local_240 = local_238.i;
                  bVar2 = QList<QTzTransition>::const_iterator::operator!=(&local_230,local_238);
                  if (!bVar2) break;
                  in_stack_fffffffffffffc08 =
                       QList<QTzTransition>::const_iterator::operator*(&local_230);
                  pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                               CONCAT44(in_stack_fffffffffffffbe4,
                                                        in_stack_fffffffffffffbe0),
                                               CONCAT44(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8));
                  if ((pQVar10->tz_isdst & 1U) == 0) {
                    pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                                 CONCAT44(in_stack_fffffffffffffbe4,
                                                          in_stack_fffffffffffffbe0),
                                                 CONCAT44(in_stack_fffffffffffffbdc,
                                                          in_stack_fffffffffffffbd8));
                    local_2bc = pQVar10->tz_gmtoff;
                    break;
                  }
                  QList<QTzTransition>::const_iterator::operator++(&local_230);
                }
                qVar8 = QList<QTzTransition>::size(&local_148);
                QList<QTzTransitionTime>::reserve
                          ((QList<QTzTransitionTime> *)in_stack_fffffffffffffc08,
                           (qsizetype)in_stack_fffffffffffffc48);
                local_2d8 = 0xe10;
                for (local_2dc = 0; local_2dc < (int)qVar8; local_2dc = local_2dc + 1) {
                  pQVar11 = QList<QTzTransition>::at
                                      ((QList<QTzTransition> *)
                                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0)
                                       ,CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8
                                                ));
                  local_250 = &DAT_aaaaaaaaaaaaaaaa;
                  local_248 = &DAT_aaaaaaaaaaaaaaaa;
                  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
                  local_98._0_1_ = 0xaa;
                  local_98._1_3_ = 0xaaaaaa;
                  QTzTransitionRule::QTzTransitionRule((QTzTransitionRule *)&local_a0);
                  local_258 = (QTzType)&DAT_aaaaaaaaaaaaaaaa;
                  pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                               CONCAT44(in_stack_fffffffffffffbe4,
                                                        in_stack_fffffffffffffbe0),
                                               CONCAT44(in_stack_fffffffffffffbdc,
                                                        in_stack_fffffffffffffbd8));
                  local_258 = *pQVar10;
                  if (((ulong)local_258 & 0x100000000) == 0) {
                    local_2bc = local_258.tz_gmtoff;
                  }
                  else if (local_258.tz_gmtoff != local_2bc + local_2d8) {
                    local_2d8 = local_258.tz_gmtoff - local_2d8;
                    local_2f0 = local_2dc;
                    do {
                      local_2f0 = local_2f0 + 1;
                      if ((int)qVar8 <= local_2f0) goto LAB_0074a420;
                      local_260 = (QTzType)&DAT_aaaaaaaaaaaaaaaa;
                      QList<QTzTransition>::at
                                ((QList<QTzTransition> *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                      pQVar10 = QList<QTzType>::at((QList<QTzType> *)
                                                   CONCAT44(in_stack_fffffffffffffbe4,
                                                            in_stack_fffffffffffffbe0),
                                                   CONCAT44(in_stack_fffffffffffffbdc,
                                                            in_stack_fffffffffffffbd8));
                      local_260 = *pQVar10;
                    } while (((ulong)local_260 & 0x100000000) != 0);
                    iVar1 = local_260.tz_gmtoff;
                    if (local_260.tz_gmtoff != local_2bc) {
                      if (local_260.tz_gmtoff == local_2d8) {
                        local_2bc = local_260.tz_gmtoff;
                      }
                      else if (local_258.tz_gmtoff + -0xe10 != local_2bc) {
                        if (local_258.tz_gmtoff + -0xe10 == local_260.tz_gmtoff) {
                          local_2bc = local_260.tz_gmtoff;
                        }
                        else {
                          if (local_260.tz_gmtoff < local_258.tz_gmtoff) {
                            bVar2 = true;
                            if (local_2bc < local_258.tz_gmtoff) {
                              local_264 = local_260.tz_gmtoff - local_2d8;
                              iVar6 = qAbs<int>(&local_264);
                              local_268 = local_2bc - local_2d8;
                              iVar7 = qAbs<int>(&local_268);
                              bVar2 = iVar6 < iVar7;
                            }
                          }
                          else {
                            bVar2 = false;
                            if (local_258.tz_gmtoff <= local_2bc) {
                              local_26c = local_260.tz_gmtoff - local_2d8;
                              in_stack_fffffffffffffbf4 = qAbs<int>(&local_26c);
                              local_270 = local_2bc - local_2d8;
                              in_stack_fffffffffffffbf0 = qAbs<int>(&local_270);
                              bVar2 = in_stack_fffffffffffffbf4 < in_stack_fffffffffffffbf0;
                            }
                          }
                          if (bVar2) {
                            local_2bc = iVar1;
                          }
                        }
                      }
                    }
LAB_0074a420:
                    local_2d8 = local_258.tz_gmtoff - local_2bc;
                  }
                  local_a0._4_4_ = local_258.tz_gmtoff - local_2bc;
                  local_a0._0_4_ = local_2bc;
                  local_98._0_1_ = local_258.tz_abbrind;
                  qVar12 = QListSpecialMethodsBase<QTzTransitionRule>::indexOf<QTzTransitionRule>
                                     ((QListSpecialMethodsBase<QTzTransitionRule> *)
                                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                      (QTzTransitionRule *)in_stack_fffffffffffffbe8,
                                      CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))
                  ;
                  if ((int)qVar12 == -1) {
                    if (local_a0._4_4_ != 0) {
                      in_RDI->m_hasDst = true;
                    }
                    in_stack_fffffffffffffbe8 = (QDataStream *)&in_RDI->m_tranRules;
                    qVar12 = QList<QTzTransitionRule>::size
                                       ((QList<QTzTransitionRule> *)in_stack_fffffffffffffbe8);
                    local_248 = (undefined1 *)CONCAT71(local_248._1_7_,(char)qVar12);
                    QList<QTzTransitionRule>::append
                              ((QList<QTzTransitionRule> *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               (parameter_type)
                               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                  }
                  else {
                    local_248 = (undefined1 *)CONCAT71(local_248._1_7_,(char)qVar12);
                  }
                  local_250 = (undefined1 *)(pQVar11->tz_time * 1000);
                  QList<QTzTransitionTime>::append
                            ((QList<QTzTransitionTime> *)
                             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                             (parameter_type)
                             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
                }
                QList<int>::~QList((QList<int> *)0x74a556);
              }
            }
          }
        }
LAB_0074a556:
        QMap<int,_QByteArray>::~QMap((QMap<int,_QByteArray> *)0x74a563);
      }
      QList<QTzType>::~QList((QList<QTzType> *)0x74a581);
    }
    QList<QTzTransition>::~QList((QList<QTzTransition> *)0x74a59f);
  }
  QByteArray::~QByteArray((QByteArray *)0x74a5bd);
  QDataStream::~QDataStream
            ((QDataStream *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
LAB_0074a5e8:
  QFile::~QFile((QFile *)0x74a5f5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::findEntry(const QByteArray &ianaId)
{
    QTzTimeZoneCacheEntry ret;
    QFile tzif;
    if (ianaId.isEmpty()) {
        // Open system tz
        tzif.setFileName(QStringLiteral("/etc/localtime"));
        if (!tzif.open(QIODevice::ReadOnly))
            return ret;
    } else if (!openZoneInfo(QString::fromLocal8Bit(ianaId), &tzif)) {
        // ianaId may be a POSIX rule, taken from $TZ or /etc/TZ
        auto check = validatePosixRule(ianaId);
        if (check.isValid) {
            ret.m_hasDst = check.hasDst;
            ret.m_posixRule = ianaId;
        }
        return ret;
    }

    QDataStream ds(&tzif);

    // Parse the old version block of data
    bool ok = false;
    QByteArray posixRule;
    QTzHeader hdr = parseTzHeader(ds, &ok);
    if (!ok || ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzTransition> tranList = parseTzTransitions(ds, hdr.tzh_timecnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QList<QTzType> typeList = parseTzTypes(ds, hdr.tzh_typecnt);
    if (ds.status() != QDataStream::Ok)
        return ret;
    QMap<int, QByteArray> abbrevMap = parseTzAbbreviations(ds, hdr.tzh_charcnt, typeList);
    if (ds.status() != QDataStream::Ok)
        return ret;
    parseTzLeapSeconds(ds, hdr.tzh_leapcnt, false);
    if (ds.status() != QDataStream::Ok)
        return ret;
    typeList = parseTzIndicators(ds, typeList, hdr.tzh_ttisstdcnt, hdr.tzh_ttisgmtcnt);
    if (ds.status() != QDataStream::Ok)
        return ret;

    // If version 2 then parse the second block of data
    if (hdr.tzh_version == '2' || hdr.tzh_version == '3') {
        ok = false;
        QTzHeader hdr2 = parseTzHeader(ds, &ok);
        if (!ok || ds.status() != QDataStream::Ok)
            return ret;
        tranList = parseTzTransitions(ds, hdr2.tzh_timecnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzTypes(ds, hdr2.tzh_typecnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        abbrevMap = parseTzAbbreviations(ds, hdr2.tzh_charcnt, typeList);
        if (ds.status() != QDataStream::Ok)
            return ret;
        parseTzLeapSeconds(ds, hdr2.tzh_leapcnt, true);
        if (ds.status() != QDataStream::Ok)
            return ret;
        typeList = parseTzIndicators(ds, typeList, hdr2.tzh_ttisstdcnt, hdr2.tzh_ttisgmtcnt);
        if (ds.status() != QDataStream::Ok)
            return ret;
        posixRule = parseTzPosixRule(ds);
        if (ds.status() != QDataStream::Ok)
            return ret;
    }
    // Translate the TZ file's raw data into our internal form:

    if (!posixRule.isEmpty()) {
        auto check = validatePosixRule(posixRule);
        if (!check.isValid) // We got a POSIX rule, but it was malformed:
            return ret;
        ret.m_posixRule = posixRule;
        ret.m_hasDst = check.hasDst;
    }

    // Translate the array-index-based tz_abbrind into list index
    const int size = abbrevMap.size();
    ret.m_abbreviations.clear();
    ret.m_abbreviations.reserve(size);
    QList<int> abbrindList;
    abbrindList.reserve(size);
    for (auto it = abbrevMap.cbegin(), end = abbrevMap.cend(); it != end; ++it) {
        ret.m_abbreviations.append(it.value());
        abbrindList.append(it.key());
    }
    // Map tz_abbrind from map's keys (as initially read) to abbrindList's
    // indices (used hereafter):
    for (int i = 0; i < typeList.size(); ++i)
        typeList[i].tz_abbrind = abbrindList.indexOf(typeList.at(i).tz_abbrind);

    // TODO: is typeList[0] always the "before zones" data ? It seems to be ...
    if (typeList.size())
        ret.m_preZoneRule = { typeList.at(0).tz_gmtoff, 0, typeList.at(0).tz_abbrind };

    // Offsets are stored as total offset, want to know separate UTC and DST offsets
    // so find the first non-dst transition to use as base UTC Offset
    int utcOffset = ret.m_preZoneRule.stdOffset;
    for (const QTzTransition &tran : std::as_const(tranList)) {
        if (!typeList.at(tran.tz_typeind).tz_isdst) {
            utcOffset = typeList.at(tran.tz_typeind).tz_gmtoff;
            break;
        }
    }

    // Now for each transition time calculate and store our rule:
    const int tranCount = tranList.size();
    ret.m_tranTimes.reserve(tranCount);
    // The DST offset when in effect: usually stable, usually an hour:
    int lastDstOff = 3600;
    for (int i = 0; i < tranCount; i++) {
        const QTzTransition &tz_tran = tranList.at(i);
        QTzTransitionTime tran;
        QTzTransitionRule rule;
        const QTzType tz_type = typeList.at(tz_tran.tz_typeind);

        // Calculate the associated Rule
        if (!tz_type.tz_isdst) {
            utcOffset = tz_type.tz_gmtoff;
        } else if (Q_UNLIKELY(tz_type.tz_gmtoff != utcOffset + lastDstOff)) {
            /*
              This might be a genuine change in DST offset, but could also be
              DST starting at the same time as the standard offset changed.  See
              if DST's end gives a more plausible utcOffset (i.e. one closer to
              the last we saw, or a simple whole hour):
            */
            // Standard offset inferred from net offset and expected DST offset:
            const int inferStd = tz_type.tz_gmtoff - lastDstOff; // != utcOffset
            for (int j = i + 1; j < tranCount; j++) {
                const QTzType new_type = typeList.at(tranList.at(j).tz_typeind);
                if (!new_type.tz_isdst) {
                    const int newUtc = new_type.tz_gmtoff;
                    if (newUtc == utcOffset) {
                        // DST-end can't help us, avoid lots of messy checks.
                    // else: See if the end matches the familiar DST offset:
                    } else if (newUtc == inferStd) {
                        utcOffset = newUtc;
                    // else: let either end shift us to one hour as DST offset:
                    } else if (tz_type.tz_gmtoff - 3600 == utcOffset) {
                        // Start does it
                    } else if (tz_type.tz_gmtoff - 3600 == newUtc) {
                        utcOffset = newUtc; // End does it
                    // else: prefer whichever end gives DST offset closer to
                    // last, but consider any offset > 0 "closer" than any <= 0:
                    } else if (newUtc < tz_type.tz_gmtoff
                               ? (utcOffset >= tz_type.tz_gmtoff
                                  || qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))
                               : (utcOffset >= tz_type.tz_gmtoff
                                  && qAbs(newUtc - inferStd) < qAbs(utcOffset - inferStd))) {
                        utcOffset = newUtc;
                    }
                    break;
                }
            }
            lastDstOff = tz_type.tz_gmtoff - utcOffset;
        }
        rule.stdOffset = utcOffset;
        rule.dstOffset = tz_type.tz_gmtoff - utcOffset;
        rule.abbreviationIndex = tz_type.tz_abbrind;

        // If the rule already exist then use that, otherwise add it
        int ruleIndex = ret.m_tranRules.indexOf(rule);
        if (ruleIndex == -1) {
            if (rule.dstOffset != 0)
                ret.m_hasDst = true;
            tran.ruleIndex = ret.m_tranRules.size();
            ret.m_tranRules.append(rule);
        } else {
            tran.ruleIndex = ruleIndex;
        }

        tran.atMSecsSinceEpoch = tz_tran.tz_time * 1000;
        ret.m_tranTimes.append(tran);
    }

    return ret;
}